

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::Context::setOption(Context *this,char *option,char *value)

{
  char *lvalue;
  String argv;
  anon_union_24_2_13149d16_for_String_2 local_c0;
  anon_union_24_2_13149d16_for_String_2 local_a8;
  String local_90;
  String local_78;
  String local_60;
  String local_48;
  String local_30;
  
  String::String(&local_48,"-");
  String::String(&local_60,option);
  operator+(&local_30,&local_48,&local_60);
  String::String(&local_78,"=");
  operator+((String *)&local_c0.data,&local_30,&local_78);
  String::String(&local_90,value);
  operator+((String *)&local_a8.data,(String *)&local_c0.data,&local_90);
  String::~String(&local_90);
  String::~String((String *)&local_c0.data);
  String::~String(&local_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  local_c0.data.ptr = (char *)&local_a8;
  if (local_a8.buf[0x17] < '\0') {
    local_c0.data.ptr = local_a8.data.ptr;
  }
  parseArgs(this,1,(char **)&local_c0,false);
  String::~String((String *)&local_a8.data);
  return;
}

Assistant:

void Context::setOption(const char* option, const char* value) {
    auto argv   = String("-") + option + "=" + value;
    auto lvalue = argv.c_str();
    parseArgs(1, &lvalue);
}